

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_image_draw_rectangle(rf_image *dst,rf_rec rec,rf_color color,rf_allocator temp_allocator)

{
  undefined1 auVar1 [16];
  rf_image src_00;
  rf_image image;
  rf_image src;
  
  if (dst->valid == true) {
    dst->valid = false;
    rf_gen_image_color(&src,(int)rec.width,(int)rec.height,color,temp_allocator);
    if (src.valid == true) {
      src_00.valid = src.valid;
      src_00._21_3_ = src._21_3_;
      src_00.format = src.format;
      src_00.width = src.width;
      src_00.height = src.height;
      src_00.data = src.data;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = rec._8_8_;
      rf_image_draw(dst,src_00,(rf_rec)(auVar1 << 0x40),rec,(rf_color)0xffffffff,temp_allocator);
      image.valid = src.valid;
      image._21_3_ = src._21_3_;
      image.format = src.format;
      image.width = src.width;
      image.height = src.height;
      image.data = src.data;
      rf_unload_image(image,temp_allocator);
    }
  }
  return;
}

Assistant:

RF_API void rf_image_draw_rectangle(rf_image* dst, rf_rec rec, rf_color color, rf_allocator temp_allocator)
{
    if (dst->valid)
    {
        dst->valid = false;

        rf_image src = rf_gen_image_color((int)rec.width, (int)rec.height, color, temp_allocator);

        if (src.valid)
        {
            rf_rec src_rec = (rf_rec){ 0, 0, rec.width, rec.height };

            rf_image_draw(dst, src, src_rec, rec, RF_WHITE, temp_allocator);

            rf_unload_image(src, temp_allocator);
        }
    }
}